

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O3

void __thiscall
MinVR::VRDataIndex::_setValueSpecialized(VRDataIndex *this,VRDatumPtr *p,VRIntArray *value)

{
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4> *this_00;
  vector<int,_std::allocator<int>_> local_30;
  
  this_00 = (VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4> *)
            VRDatumPtr::intArrayVal(p);
  std::vector<int,_std::allocator<int>_>::vector(&local_30,value);
  VRDatumSpecialized<std::vector<int,_std::allocator<int>_>,_(MinVR::VRCORETYPE_ID)4>::setValue
            (this_00,&local_30);
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void _setValueSpecialized(VRDatumPtr p, VRIntArray value) {
    p.intArrayVal()->setValue(value);
  }